

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlSubstitutionItem::DebugXmlRhs
          (GdlSubstitutionItem *this,GrcManager *pcman,ofstream *strmOut,string *param_3)

{
  ostream *poVar1;
  pointer ppGVar2;
  long lVar3;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)strmOut,"          <rhsSlot className=\"",0x1e);
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_50,this->m_psymOutput);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)strmOut,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (this->m_pexpSelector != (GdlSlotRefExpression *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,"\" selectorIndex=\"",0x11);
    std::ostream::operator<<(strmOut,this->m_pexpSelector->m_srNumber);
  }
  if ((this->m_vpexpAssocs).
      super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_vpexpAssocs).
      super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" associations=\"",0x10)
    ;
    ppGVar2 = (this->m_vpexpAssocs).
              super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar3 = 0;
    if (1 < (int)((ulong)((long)(this->m_vpexpAssocs).
                                super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2) >> 3)) {
      do {
        poVar1 = (ostream *)std::ostream::operator<<(strmOut,ppGVar2[lVar3]->m_srNumber);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        lVar3 = lVar3 + 1;
        ppGVar2 = (this->m_vpexpAssocs).
                  super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar3 < ((long)(this->m_vpexpAssocs).
                              super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2) *
                       0x20000000 + -0x100000000 >> 0x20);
    }
    std::ostream::operator<<(strmOut,ppGVar2[lVar3]->m_srNumber);
  }
  if ((this->super_GdlSetAttrItem).m_vpavs.
      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_GdlSetAttrItem).m_vpavs.
      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,"\" assignmentGdl=\"",0x11);
    (*(this->super_GdlSetAttrItem).super_GdlRuleItem._vptr_GdlRuleItem[0x27])
              (this,pcman,0,0,strmOut,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" slotIndex=\"",0xd);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (strmOut,(this->super_GdlSetAttrItem).super_GdlRuleItem.m_iritContextPos + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" />\n",5);
  return;
}

Assistant:

void GdlSubstitutionItem::DebugXmlRhs(GrcManager * pcman, std::ofstream & strmOut,
	std::string /*staPathToCur*/)
{
	strmOut << "          <rhsSlot className=\"" << m_psymOutput->FullAbbrev();
	
	if (m_pexpSelector)
		strmOut << "\" selectorIndex=\"" << m_pexpSelector->SlotNumber();

	if (m_vpexpAssocs.size() > 0)
	{
		strmOut << "\" associations=\"";
		int iexp;
		for (iexp = 0; iexp < signed(m_vpexpAssocs.size()) - 1; iexp++)
			strmOut << m_vpexpAssocs[iexp]->SlotNumber() << " ";
		strmOut << m_vpexpAssocs[iexp]->SlotNumber();
	}

	if (m_vpavs.size() > 0)
	{
		strmOut << "\" assignmentGdl=\"";
		AttrSetterPrettyPrint(pcman, NULL, 0, strmOut, true);	// NULL and 0 are bogus but not used
	}
	strmOut << "\" slotIndex=\"" << m_iritContextPos + 1 << "\" />\n";

}